

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  CoverageIffClauseSyntax *pCVar1;
  Token *unaff_retaddr;
  Token *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_000000f8;
  Token *in_stack_00000100;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Token *args_3;
  
  args_3 = (Token *)__child_stack;
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x943c10);
  deepClone<slang::syntax::ExpressionSyntax>
            ((ExpressionSyntax *)__child_stack,in_stack_ffffffffffffffa8);
  parsing::Token::deepClone(in_stack_00000100,in_stack_000000f8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CoverageIffClauseSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,(ExpressionSyntax *)__fn,
                      args_3);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CoverageIffClauseSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CoverageIffClauseSyntax>(
        node.iff.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.expr, alloc),
        node.closeParen.deepClone(alloc)
    );
}